

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.h
# Opt level: O0

CurrencyPluralInfoWrapper * __thiscall
icu_63::number::impl::CurrencyPluralInfoWrapper::operator=
          (CurrencyPluralInfoWrapper *this,CurrencyPluralInfoWrapper *other)

{
  UBool UVar1;
  CurrencyPluralInfo *this_00;
  CurrencyPluralInfo *info;
  CurrencyPluralInfoWrapper *size;
  undefined8 local_48;
  CurrencyPluralInfoWrapper *other_local;
  CurrencyPluralInfoWrapper *this_local;
  
  size = other;
  UVar1 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                    ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)other);
  if (UVar1 == '\0') {
    this_00 = (CurrencyPluralInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    local_48 = (CurrencyPluralInfo *)0x0;
    if (this_00 != (CurrencyPluralInfo *)0x0) {
      info = LocalPointerBase<icu_63::CurrencyPluralInfo>::operator*
                       ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)other);
      CurrencyPluralInfo::CurrencyPluralInfo(this_00,info);
      local_48 = this_00;
    }
    LocalPointer<icu_63::CurrencyPluralInfo>::adoptInstead(&this->fPtr,local_48);
  }
  return this;
}

Assistant:

CurrencyPluralInfoWrapper& operator=(const CurrencyPluralInfoWrapper& other) {
        if (!other.fPtr.isNull()) {
            fPtr.adoptInstead(new CurrencyPluralInfo(*other.fPtr));
        }
        return *this;
    }